

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::state::reset(state *this)

{
  undefined4 *in_RDI;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[8] = 0;
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_c * 2 + 0x24));
  }
  for (local_10 = 0; local_10 < 0xc; local_10 = local_10 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_10 * 2 + 0x3c));
  }
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_14 * 2 + 0x54));
  }
  for (local_18 = 0; local_18 < 0xc; local_18 = local_18 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_18 * 2 + 0x6c));
  }
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_1c * 2 + 0x84));
  }
  for (local_20 = 0; local_20 < 0xc; local_20 = local_20 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)((long)in_RDI + (ulong)local_20 * 2 + 0x9c));
  }
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    lzham::quasi_adaptive_huffman_data_model::reset();
    lzham::quasi_adaptive_huffman_data_model::reset();
  }
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  in_RDI[2] = 1;
  in_RDI[3] = 1;
  in_RDI[4] = 1;
  in_RDI[5] = 1;
  return;
}

Assistant:

void lzcompressor::state::reset()
   {
      m_cur_ofs = 0;
      m_cur_state = 0;
      m_block_start_dict_ofs = 0;

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++) 
         m_is_match_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep_model); i++) 
         m_is_rep_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_model); i++) 
         m_is_rep0_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_single_byte_model); i++) 
         m_is_rep0_single_byte_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep1_model); i++) 
         m_is_rep1_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep2_model); i++) 
         m_is_rep2_model[i].clear();
      
      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].reset();
         m_large_len_table[i].reset();
      }
      m_main_table.reset();
      m_dist_lsb_table.reset();

      m_lit_table.reset();
      m_delta_lit_table.reset();
      
      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
   }